

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handshake.cc
# Opt level: O3

bool bssl::ssl_add_message_cbb(SSL *ssl,CBB *cbb)

{
  _func_bool_SSL_ptr_Array<unsigned_char> *p_Var1;
  bool bVar2;
  size_t extraout_RDX;
  Array<unsigned_char> AVar3;
  uchar *local_38;
  size_t sStack_30;
  Array<unsigned_char> local_28;
  
  local_28.data_ = (uchar *)0x0;
  local_28.size_ = 0;
  bVar2 = (*ssl->method->finish_message)(ssl,cbb,&local_28);
  if (bVar2) {
    p_Var1 = ssl->method->add_message;
    local_38 = (uchar *)0x0;
    sStack_30 = 0;
    OPENSSL_free((void *)0x0);
    local_38 = local_28.data_;
    sStack_30 = local_28.size_;
    local_28.data_ = (uchar *)0x0;
    local_28.size_ = 0;
    AVar3.size_ = extraout_RDX;
    AVar3.data_ = (uchar *)&local_38;
    bVar2 = (*p_Var1)(ssl,AVar3);
    OPENSSL_free(local_38);
    local_38 = (uchar *)0x0;
    sStack_30 = 0;
  }
  else {
    bVar2 = false;
  }
  OPENSSL_free(local_28.data_);
  return bVar2;
}

Assistant:

bool ssl_add_message_cbb(SSL *ssl, CBB *cbb) {
  Array<uint8_t> msg;
  if (!ssl->method->finish_message(ssl, cbb, &msg) ||
      !ssl->method->add_message(ssl, std::move(msg))) {
    return false;
  }

  return true;
}